

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O3

int CVAfindIndex(CVodeMem cv_mem,sunrealtype t,long *indx,int *newpoint)

{
  double dVar1;
  double dVar2;
  CVadjMemRec *pCVar3;
  CVdtpntMemRec **ppCVar4;
  long lVar5;
  long lVar6;
  
  pCVar3 = cv_mem->cv_adj_mem;
  ppCVar4 = pCVar3->dt_mem;
  *newpoint = 0;
  dVar1 = pCVar3->ca_tinitial;
  dVar2 = pCVar3->ca_tfinal;
  if (pCVar3->ca_IMnewData == 0) {
    lVar6 = pCVar3->ca_ilast;
  }
  else {
    lVar6 = pCVar3->ca_np + -1;
    pCVar3->ca_ilast = lVar6;
    *newpoint = 1;
    pCVar3->ca_IMnewData = 0;
  }
  dVar1 = *(double *)(&DAT_00138070 + (ulong)(dVar1 < dVar2) * 8);
  if (0.0 <= (t - ppCVar4[lVar6 + -1]->t) * dVar1) {
    if ((t - ppCVar4[lVar6]->t) * dVar1 <= 0.0) {
      *indx = lVar6;
    }
    else {
      *newpoint = 1;
      lVar6 = lVar6 + -1;
      do {
        lVar5 = lVar6 + 1;
        lVar6 = lVar6 + 1;
      } while (0.0 < (t - ppCVar4[lVar5]->t) * dVar1);
      *indx = lVar6;
      pCVar3->ca_ilast = lVar6;
    }
  }
  else {
    *newpoint = 1;
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      if (0.0 < (t - ppCVar4[lVar6 + -1]->t) * dVar1) goto LAB_00111919;
    }
    lVar6 = 0;
LAB_00111919:
    *indx = lVar6;
    pCVar3->ca_ilast = lVar6 + (ulong)(lVar6 == 0);
    if ((*indx == 0) && (cv_mem->cv_uround * 1000000.0 < ABS(t - (*ppCVar4)->t))) {
      return -0x6b;
    }
  }
  return 0;
}

Assistant:

static int CVAfindIndex(CVodeMem cv_mem, sunrealtype t, long int* indx,
                        sunbooleantype* newpoint)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  int sign;
  sunbooleantype to_left, to_right;

  ca_mem = cv_mem->cv_adj_mem;
  dt_mem = ca_mem->dt_mem;

  *newpoint = SUNFALSE;

  /* Find the direction of integration */
  sign = (ca_mem->ca_tfinal - ca_mem->ca_tinitial > ZERO) ? 1 : -1;

  /* If this is the first time we use new data */
  if (ca_mem->ca_IMnewData)
  {
    ca_mem->ca_ilast     = ca_mem->ca_np - 1;
    *newpoint            = SUNTRUE;
    ca_mem->ca_IMnewData = SUNFALSE;
  }

  /* Search for indx starting from ilast */
  to_left  = (sign * (t - dt_mem[ca_mem->ca_ilast - 1]->t) < ZERO);
  to_right = (sign * (t - dt_mem[ca_mem->ca_ilast]->t) > ZERO);

  if (to_left)
  {
    /* look for a new indx to the left */

    *newpoint = SUNTRUE;

    *indx = ca_mem->ca_ilast;
    for (;;)
    {
      if (*indx == 0) { break; }
      if (sign * (t - dt_mem[*indx - 1]->t) <= ZERO) { (*indx)--; }
      else { break; }
    }

    if (*indx == 0) { ca_mem->ca_ilast = 1; }
    else { ca_mem->ca_ilast = *indx; }

    if (*indx == 0)
    {
      /* t is beyond leftmost limit. Is it too far? */
      if (SUNRabs(t - dt_mem[0]->t) > FUZZ_FACTOR * cv_mem->cv_uround)
      {
        return (CV_GETY_BADT);
      }
    }
  }
  else if (to_right)
  {
    /* look for a new indx to the right */

    *newpoint = SUNTRUE;

    *indx = ca_mem->ca_ilast;
    for (;;)
    {
      if (sign * (t - dt_mem[*indx]->t) > ZERO) { (*indx)++; }
      else { break; }
    }

    ca_mem->ca_ilast = *indx;
  }
  else
  {
    /* ilast is still OK */

    *indx = ca_mem->ca_ilast;
  }

  return (CV_SUCCESS);
}